

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O1

void Cmd_secret(FCommandLine *argv,APlayerPawn *who,int key)

{
  byte bVar1;
  FBrokenLines *pFVar2;
  int iVar3;
  FString __s1;
  char *pcVar4;
  long lVar5;
  undefined8 *puVar6;
  PClass *pPVar7;
  undefined8 uVar8;
  PClass *pPVar9;
  level_info_t *plVar10;
  char *name;
  FBrokenLines *lines;
  undefined8 extraout_RAX;
  ulong uVar11;
  uint uVar12;
  undefined8 *puVar13;
  bool bVar14;
  FString levelname;
  FString linebuild;
  FString maphdr;
  FWadLump lump;
  char readbuffer [1024];
  FString local_4b8;
  FString local_4b0;
  int local_4a8;
  uint local_4a4;
  char *local_4a0;
  FString local_498;
  FName local_48c;
  ulong local_488;
  char *local_480;
  char *local_478;
  FWadLump local_470;
  char local_438 [1032];
  
  iVar3 = FCommandLine::argc(argv);
  __s1 = level.MapName;
  if (1 < iVar3) {
    __s1.Chars = FCommandLine::operator[](argv,1);
  }
  local_4a8 = strcasecmp(__s1.Chars,level.MapName.Chars);
  iVar3 = FWadCollection::CheckNumForName(&Wads,"SECRETS",0);
  if (-1 < iVar3) {
    FWadCollection::OpenLumpNum(&local_470,&Wads,iVar3);
    local_498.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FString::Format(&local_498,"[%s]",__s1.Chars);
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    local_4a0 = "\x1cV";
    if (local_4a8 == 0) {
      local_4a0 = "\x1cK";
    }
    local_480 = FString::NullString.Nothing;
    local_4b0.Chars = FString::NullString.Nothing;
    local_4a4 = 0;
    local_488 = 0;
    local_478 = __s1.Chars;
    while (pcVar4 = FWadLump::Gets(&local_470,local_438,0x400), pcVar4 != (char *)0x0) {
      if ((local_4a4 & 1) == 0) {
        if (local_438[0] == '[') {
          iVar3 = strncasecmp(local_438,local_498.Chars,
                              (ulong)((FNullStringData *)(local_498.Chars + -0xc))->Len);
          pcVar4 = local_478;
          local_4a4 = CONCAT31((int3)((uint)iVar3 >> 8),iVar3 == 0);
          if ((local_488 & 1) == 0) {
            local_4b8.Chars = local_480;
            FString::NullString.RefCount = FString::NullString.RefCount + 1;
            plVar10 = FindLevelInfo(local_478,true);
            name = (plVar10->LevelName).Chars;
            if ((plVar10->flags & 0x4000000) != 0) {
              name = FStringTable::operator[](&GStrings,name);
            }
            FString::Format(&local_4b8,"%s - %s\n",pcVar4,name);
            uVar11 = (ulong)((FNullStringData *)(local_4b8.Chars + -0xc))->Len;
            while (uVar11 = uVar11 - 1, uVar11 != 0) {
              FString::operator+=(&local_4b8,'-');
            }
            Printf("\x1cK%s\n",local_4b8.Chars);
            FString::~FString(&local_4b8);
            local_488 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
        }
      }
      else if (local_438[0] == '[') {
        local_4a4 = 0;
      }
      else {
        FString::operator+=(&local_4b0,local_438);
        if ((((FNullStringData *)(local_4b0.Chars + -0xc))->Len < 0x3ff) ||
           (local_4b0.Chars[0x3fe] == '\n')) {
          FString::Substitute(&local_4b0,"\r",(char *)"");
          FString::StripRight(&local_4b0," \t\n");
          local_4b8.Chars = local_4b0.Chars;
          if (local_4b0.Chars != (char *)0x0) {
            pcVar4 = local_4a0;
            if (*local_4b0.Chars == '$') {
              bVar1 = local_4b0.Chars[1];
              if (bVar1 < 0x73) {
                if (bVar1 == 0x53) {
LAB_00350d37:
                  lVar5 = strtol(local_4b0.Chars + 2,&local_4b8.Chars,10);
                  if (*local_4b8.Chars == ';') {
                    local_4b8.Chars = local_4b8.Chars + 1;
                  }
                  pcVar4 = local_4a0;
                  if (((local_4a8 == 0) && (-1 < lVar5)) && (lVar5 < numsectors)) {
                    pcVar4 = "\x1cG";
                    if ((-1 < (int)sectors[lVar5].Flags) &&
                       (pcVar4 = "\x1cD", sectors[lVar5].Flags < 0x40000000)) {
                      pcVar4 = "\x1cI";
                    }
                  }
                }
                else if (bVar1 == 0x54) goto LAB_00350dd1;
              }
              else if (bVar1 == 0x74) {
LAB_00350dd1:
                lVar5 = strtol(local_4b0.Chars + 2,&local_4b8.Chars,10);
                if (*local_4b8.Chars == ';') {
                  local_4b8.Chars = local_4b8.Chars + 1;
                }
                pcVar4 = "\x1cD";
                if (local_4a8 == 0) {
                  uVar12 = (uint)lVar5;
                  puVar13 = (undefined8 *)0x0;
                  do {
                    if (uVar12 == 0) {
                      puVar6 = (undefined8 *)0x0;
                    }
                    else {
                      puVar6 = puVar13 + 0x57;
                      if (puVar13 == (undefined8 *)0x0) {
                        puVar6 = (undefined8 *)
                                 ((long)AActor::TIDHash + (ulong)((uVar12 & 0x7f) << 3));
                      }
                      for (puVar6 = (undefined8 *)*puVar6;
                          (puVar13 = puVar6, puVar6 != (undefined8 *)0x0 &&
                          (*(uint *)(puVar6 + 0x52) != uVar12)); puVar6 = (undefined8 *)puVar6[0x57]
                          ) {
                      }
                    }
                    if (puVar6 == (undefined8 *)0x0) {
                      pcVar4 = "\x1cD";
                      goto LAB_00350f9a;
                    }
                    local_48c.Index =
                         FName::NameManager::FindName(&FName::NameData,"SecretTrigger",true);
                    pPVar7 = PClass::FindClass(&local_48c);
                    if (puVar6[1] == 0) {
                      uVar8 = (**(code **)*puVar6)(puVar6);
                      puVar6[1] = uVar8;
                    }
                    pPVar9 = (PClass *)puVar6[1];
                    bVar14 = pPVar9 != (PClass *)0x0;
                    if (pPVar9 != pPVar7 && bVar14) {
                      do {
                        pPVar9 = pPVar9->ParentClass;
                        bVar14 = pPVar9 != (PClass *)0x0;
                        if (pPVar9 == pPVar7) break;
                      } while (pPVar9 != (PClass *)0x0);
                    }
                  } while (!bVar14);
                  pcVar4 = "\x1cG";
                }
              }
              else if (bVar1 == 0x73) goto LAB_00350d37;
            }
LAB_00350f9a:
            lines = V_BreakLines(ConFont,((screen->super_DSimpleCanvas).super_DCanvas.Width * 0x5f)
                                         / 100,(BYTE *)local_4b8.Chars,false);
            iVar3 = lines->Width;
            pFVar2 = lines;
            while (-1 < iVar3) {
              Printf("%s%s\n",pcVar4,(pFVar2->Text).Chars);
              iVar3 = pFVar2[1].Width;
              pFVar2 = pFVar2 + 1;
            }
            V_FreeBrokenLines(lines);
          }
          FString::operator=(&local_4b0,(char *)"");
        }
      }
    }
    FString::~FString(&local_4b0);
    FString::~FString(&local_498);
    FWadLump::~FWadLump(&local_470);
  }
  return;
}

Assistant:

CCMD(secret)
{
	const char *mapname = argv.argc() < 2? level.MapName.GetChars() : argv[1];
	bool thislevel = !stricmp(mapname, level.MapName);
	bool foundsome = false;

	int lumpno=Wads.CheckNumForName("SECRETS");
	if (lumpno < 0) return;

	FWadLump lump = Wads.OpenLumpNum(lumpno);
	FString maphdr;
	maphdr.Format("[%s]", mapname);

	FString linebuild;
	char readbuffer[1024];
	bool inlevel = false;

	while (lump.Gets(readbuffer, 1024))
	{
		if (!inlevel)
		{
			if (readbuffer[0] == '[')
			{
				inlevel = !strnicmp(readbuffer, maphdr, maphdr.Len());
				if (!foundsome)
				{
					FString levelname;
					level_info_t *info = FindLevelInfo(mapname);
					const char *ln = !(info->flags & LEVEL_LOOKUPLEVELNAME)? info->LevelName.GetChars() : GStrings[info->LevelName.GetChars()];
					levelname.Format("%s - %s\n", mapname, ln);
					size_t llen = levelname.Len() - 1;
					for(size_t ii=0; ii<llen; ii++) levelname += '-';
					Printf(TEXTCOLOR_YELLOW"%s\n", levelname.GetChars());
					foundsome = true;
				}
			}
			continue;
		}
		else
		{
			if (readbuffer[0] != '[')
			{
				linebuild += readbuffer;
				if (linebuild.Len() < 1023 || linebuild[1022] == '\n')
				{
					// line complete so print it.
					linebuild.Substitute("\r", "");
					linebuild.StripRight(" \t\n");
					PrintSecretString(linebuild, thislevel);
					linebuild = "";
				}
			}
			else inlevel = false;
		}
	}
}